

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O0

void check_handling(display *d,int def,png_uint_32 chunks,png_uint_32 known,png_uint_32 unknown,
                   char *position,int set_callback)

{
  uint flag_00;
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *local_48;
  char *errorx;
  char *type;
  int keep;
  int i;
  png_uint_32 flag;
  char *position_local;
  png_uint_32 unknown_local;
  png_uint_32 known_local;
  png_uint_32 chunks_local;
  int def_local;
  display *d_local;
  
  for (unknown_local = chunks; unknown_local != 0;
      unknown_local = (flag_00 ^ 0xffffffff) & unknown_local) {
    flag_00 = unknown_local & -unknown_local;
    iVar1 = find_by_flag(flag_00);
    type._4_4_ = chunk_info[iVar1].keep;
    local_48 = (char *)0x0;
    if (chunk_info[iVar1].unknown == 0) {
      errorx = "KNOWN";
      if ((flag_00 & known) == 0) {
        switch(type._4_4_) {
        case 0:
          local_48 = "DEFAULT: known chunk not processed";
          break;
        case 1:
          if ((flag_00 & unknown) != 0) {
            local_48 = "DISCARD: known chunk saved";
          }
          break;
        case 2:
          iVar2 = ancillary(chunk_info[iVar1].name);
          if (iVar2 == 0) {
            if ((flag_00 & unknown) != 0) {
              local_48 = "IF-SAFE: known critical chunk saved";
            }
          }
          else if ((flag_00 & unknown) == 0) {
            local_48 = "IF-SAFE: known ancillary chunk lost";
          }
          break;
        case 3:
          if ((flag_00 & unknown) == 0) {
            local_48 = "SAVE: known chunk lost";
          }
          break;
        default:
          local_48 = "internal error: bad keep (2)";
        }
      }
      else if (type._4_4_ != 0) {
        local_48 = "!DEFAULT: known chunk processed";
      }
    }
    else {
      if (type._4_4_ == 0) {
        errorx = "UNKNOWN (default)";
        type._4_4_ = def;
      }
      else {
        errorx = "UNKNOWN (specified)";
      }
      if ((flag_00 & known) == 0) {
        switch(type._4_4_) {
        case 0:
          if ((flag_00 & unknown) != 0) {
            local_48 = "DEFAULT: unknown chunk saved";
          }
          break;
        case 1:
          if ((flag_00 & unknown) != 0) {
            local_48 = "DISCARD: unknown chunk saved";
          }
          break;
        case 2:
          iVar2 = ancillary(chunk_info[iVar1].name);
          if (iVar2 == 0) {
            if ((flag_00 & unknown) != 0) {
              local_48 = "IF-SAFE: unknown critical chunk saved";
            }
          }
          else if ((flag_00 & unknown) == 0) {
            local_48 = "IF-SAFE: unknown ancillary chunk lost";
          }
          break;
        case 3:
          if ((flag_00 & unknown) == 0) {
            local_48 = "SAVE: unknown chunk lost";
          }
          break;
        default:
          local_48 = "internal error: bad keep";
        }
      }
      else {
        local_48 = "chunk processed";
      }
    }
    if (local_48 != (char *)0x0) {
      d->error_count = d->error_count + 1;
      pcVar3 = "";
      if (set_callback != 0) {
        pcVar3 = ",callback";
      }
      fprintf(_stderr,"%s(%s%s): %s %s %s: %s\n",d->file,d->test,pcVar3,errorx,chunk_info + iVar1,
              position,local_48);
    }
  }
  return;
}

Assistant:

static void
check_handling(display *d, int def, png_uint_32 chunks, png_uint_32 known,
   png_uint_32 unknown, const char *position, int set_callback)
{
   while (chunks)
   {
      png_uint_32 flag = chunks & -(png_int_32)chunks;
      int i = find_by_flag(flag);
      int keep = chunk_info[i].keep;
      const char *type;
      const char *errorx = NULL;

      if (chunk_info[i].unknown)
      {
         if (keep == PNG_HANDLE_CHUNK_AS_DEFAULT)
         {
            type = "UNKNOWN (default)";
            keep = def;
         }

         else
            type = "UNKNOWN (specified)";

         if (flag & known)
            errorx = "chunk processed";

         else switch (keep)
         {
            case PNG_HANDLE_CHUNK_AS_DEFAULT:
               if (flag & unknown)
                  errorx = "DEFAULT: unknown chunk saved";
               break;

            case PNG_HANDLE_CHUNK_NEVER:
               if (flag & unknown)
                  errorx = "DISCARD: unknown chunk saved";
               break;

            case PNG_HANDLE_CHUNK_IF_SAFE:
               if (ancillary(chunk_info[i].name))
               {
                  if (!(flag & unknown))
                     errorx = "IF-SAFE: unknown ancillary chunk lost";
               }

               else if (flag & unknown)
                  errorx = "IF-SAFE: unknown critical chunk saved";
               break;

            case PNG_HANDLE_CHUNK_ALWAYS:
               if (!(flag & unknown))
                  errorx = "SAVE: unknown chunk lost";
               break;

            default:
               errorx = "internal error: bad keep";
               break;
         }
      } /* unknown chunk */

      else /* known chunk */
      {
         type = "KNOWN";

         if (flag & known)
         {
            /* chunk was processed, it won't have been saved because that is
             * caught below when checking for inconsistent processing.
             */
            if (keep != PNG_HANDLE_CHUNK_AS_DEFAULT)
               errorx = "!DEFAULT: known chunk processed";
         }

         else /* not processed */ switch (keep)
         {
            case PNG_HANDLE_CHUNK_AS_DEFAULT:
               errorx = "DEFAULT: known chunk not processed";
               break;

            case PNG_HANDLE_CHUNK_NEVER:
               if (flag & unknown)
                  errorx = "DISCARD: known chunk saved";
               break;

            case PNG_HANDLE_CHUNK_IF_SAFE:
               if (ancillary(chunk_info[i].name))
               {
                  if (!(flag & unknown))
                     errorx = "IF-SAFE: known ancillary chunk lost";
               }

               else if (flag & unknown)
                  errorx = "IF-SAFE: known critical chunk saved";
               break;

            case PNG_HANDLE_CHUNK_ALWAYS:
               if (!(flag & unknown))
                  errorx = "SAVE: known chunk lost";
               break;

            default:
               errorx = "internal error: bad keep (2)";
               break;
         }
      }

      if (errorx != NULL)
      {
         ++(d->error_count);
         fprintf(stderr, "%s(%s%s): %s %s %s: %s\n", d->file, d->test,
            set_callback ? ",callback" : "",
            type, chunk_info[i].name, position, errorx);
      }

      chunks &= ~flag;
   }
}